

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int vrf_part(part_t *part,int mode)

{
  char *xx_5;
  char *xx_4;
  char *xx_3;
  char *xx_2;
  char *xx_1;
  char *xx;
  int mode_local;
  part_t *part_local;
  
  tdefs[0].vtotal = part->partkey + tdefs[0].vtotal;
  for (xx = part->name; *xx != '\0'; xx = xx + 1) {
    tdefs[0].vtotal = (long)*xx + tdefs[0].vtotal;
  }
  for (xx_1 = part->mfgr; *xx_1 != '\0'; xx_1 = xx_1 + 1) {
    tdefs[0].vtotal = (long)*xx_1 + tdefs[0].vtotal;
  }
  for (xx_2 = part->brand; *xx_2 != '\0'; xx_2 = xx_2 + 1) {
    tdefs[0].vtotal = (long)*xx_2 + tdefs[0].vtotal;
  }
  for (xx_3 = part->type; *xx_3 != '\0'; xx_3 = xx_3 + 1) {
    tdefs[0].vtotal = (long)*xx_3 + tdefs[0].vtotal;
  }
  tdefs[0].vtotal = part->size + tdefs[0].vtotal;
  for (xx_4 = part->container; *xx_4 != '\0'; xx_4 = xx_4 + 1) {
    tdefs[0].vtotal = (long)*xx_4 + tdefs[0].vtotal;
  }
  for (xx_5 = part->category; *xx_5 != '\0'; xx_5 = xx_5 + 1) {
    tdefs[0].vtotal = (long)*xx_5 + tdefs[0].vtotal;
  }
  return 0;
}

Assistant:

int
vrf_part(part_t *part, int mode)
{

    UNUSED(mode);
    VRF_STRT(PART);
    VRF_INT(PART, part->partkey);
    VRF_STR(PART, part->name);
    VRF_STR(PART, part->mfgr);
    VRF_STR(PART, part->brand);
    VRF_STR(PART, part->type);
    VRF_INT(PART, part->size);
    VRF_STR(PART, part->container);
    VRF_STR(PART, part->category);
    VRF_END(PART);

    return(0);
}